

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O1

void __thiscall
CFG::anon_unknown_11::Optimizer::MergeBranchInto(Optimizer *this,Branch *Curr,Branch *Into)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  bool bVar5;
  Binary *this_00;
  
  if (Curr == Into) {
    __assert_fail("Curr != Into",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/Relooper.cpp"
                  ,0x3cc,
                  "void CFG::(anonymous namespace)::Optimizer::MergeBranchInto(Branch *, Branch *)")
    ;
  }
  pvVar1 = (Curr->SwitchValues)._M_t.
           super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
           ._M_head_impl;
  if (pvVar1 == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    pEVar4 = Curr->Condition;
    if (pEVar4 == (Expression *)0x0) {
      pvVar1 = (Into->SwitchValues)._M_t.
               super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               .
               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
               ._M_head_impl;
      Into->Condition = (Expression *)0x0;
      (Into->SwitchValues)._M_t.
      super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      if (pvVar1 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &Into->SwitchValues,pvVar1);
      }
    }
    else {
      pEVar3 = Into->Condition;
      if (pEVar3 != (Expression *)0x0) {
        if ((Into->SwitchValues)._M_t.
            super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          __assert_fail("!Into->SwitchValues",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/Relooper.cpp"
                        ,0x3df,
                        "void CFG::(anonymous namespace)::Optimizer::MergeBranchInto(Branch *, Branch *)"
                       );
        }
        this_00 = (Binary *)
                  MixedArena::allocSpace
                            (&((this->super_RelooperRecursor).Parent)->Module->allocator,0x28,8);
        (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
             BinaryId;
        (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        this_00->op = OrInt32;
        this_00->left = pEVar3;
        this_00->right = pEVar4;
        ::wasm::Binary::finalize(this_00);
        Into->Condition = (Expression *)this_00;
      }
    }
  }
  else {
    pvVar2 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
             (Into->SwitchValues)._M_t.
             super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             .
             super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
             ._M_head_impl;
    if (pvVar2 == (vector<unsigned_int,std::allocator<unsigned_int>> *)0x0) {
      if (Into->Condition != (Expression *)0x0) {
        __assert_fail("!Into->Condition",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/Relooper.cpp"
                      ,0x3cf,
                      "void CFG::(anonymous namespace)::Optimizer::MergeBranchInto(Branch *, Branch *)"
                     );
      }
    }
    else {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (pvVar2,*(undefined8 *)(pvVar2 + 8),
                 *(undefined8 *)
                  &(pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 ,*(pointer *)
                   ((long)&(pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                           ._M_impl + 8));
    }
  }
  pEVar4 = Curr->Code;
  if (pEVar4 != (Expression *)0x0) {
    if (Into->Code == (Expression *)0x0) {
      Into->Code = pEVar4;
    }
    else {
      bVar5 = ::wasm::ExpressionAnalyzer::equal(Into->Code,pEVar4);
      if (!bVar5) {
        __assert_fail("IsCodeEquivalent(Into->Code, Curr->Code)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/Relooper.cpp"
                      ,0x3ec,
                      "void CFG::(anonymous namespace)::Optimizer::MergeBranchInto(Branch *, Branch *)"
                     );
      }
    }
  }
  return;
}

Assistant:

void MergeBranchInto(Branch* Curr, Branch* Into) {
    assert(Curr != Into);
    if (Curr->SwitchValues) {
      if (!Into->SwitchValues) {
        assert(!Into->Condition);
        // Merging into the already-default, nothing to do.
      } else {
        Into->SwitchValues->insert(Into->SwitchValues->end(),
                                   Curr->SwitchValues->begin(),
                                   Curr->SwitchValues->end());
      }
    } else {
      if (!Curr->Condition) {
        // This is now the new default. Whether Into has a condition
        // or switch values, remove them all to make us the default.
        Into->Condition = nullptr;
        Into->SwitchValues.reset();
      } else if (!Into->Condition) {
        // Nothing to do, already the default.
      } else {
        assert(!Into->SwitchValues);
        // Merge them, checking both.
        Into->Condition =
          wasm::Builder(*Parent->Module)
            .makeBinary(wasm::OrInt32, Into->Condition, Curr->Condition);
      }
    }
    if (!Curr->Code) {
      // No code to merge in.
    } else if (!Into->Code) {
      // Just use the code being merged in.
      Into->Code = Curr->Code;
    } else {
      assert(IsCodeEquivalent(Into->Code, Curr->Code));
      // Keep the code already there, either is fine.
    }
  }